

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O0

void DestroyVocab(void)

{
  int local_c;
  int a;
  
  for (local_c = 0; local_c < vocab_size; local_c = local_c + 1) {
    if (vocab[local_c].word != (char *)0x0) {
      free(vocab[local_c].word);
    }
    if (vocab[local_c].code != (int8_t *)0x0) {
      free(vocab[local_c].code);
    }
    if (vocab[local_c].point != (int *)0x0) {
      free(vocab[local_c].point);
    }
  }
  free(vocab[vocab_size].word);
  free(vocab);
  return;
}

Assistant:

void DestroyVocab() {
  int a;

  for (a = 0; a < vocab_size; a++) {
    if (vocab[a].word != NULL) {
      free(vocab[a].word);
    }
    if (vocab[a].code != NULL) {
      free(vocab[a].code);
    }
    if (vocab[a].point != NULL) {
      free(vocab[a].point);
    }
  }
  free(vocab[vocab_size].word);
  free(vocab);
}